

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.c
# Opt level: O0

void do_flag(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *pCVar4;
  OBJ_DATA *pOVar5;
  long lVar6;
  __type_conflict2 _Var7;
  flag_type *flag_table;
  char type;
  long pos2;
  long pos;
  long *flag;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char word [4608];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffb758;
  flag_type *in_stack_ffffffffffffb760;
  CHAR_DATA *in_stack_ffffffffffffb768;
  flag_type *in_stack_ffffffffffffb770;
  char *in_stack_ffffffffffffb780;
  char *pcVar8;
  char *in_stack_ffffffffffffb788;
  flag_type *local_4850;
  long local_4840;
  long local_4838;
  flag_type *local_4830;
  char local_4818;
  char *in_stack_ffffffffffffc960;
  CHAR_DATA *in_stack_ffffffffffffc968;
  char local_3618;
  char *in_stack_ffffffffffffdb60;
  CHAR_DATA *in_stack_ffffffffffffdb68;
  char local_2418;
  char local_1218;
  char *local_10;
  
  local_4840 = -99;
  one_argument((char *)in_stack_ffffffffffffb760,(char *)in_stack_ffffffffffffb758);
  one_argument((char *)in_stack_ffffffffffffb760,(char *)in_stack_ffffffffffffb758);
  local_10 = one_argument((char *)in_stack_ffffffffffffb760,(char *)in_stack_ffffffffffffb758);
  cVar1 = *local_10;
  if (((cVar1 == '=') || (cVar1 == '-')) || (cVar1 == '+')) {
    local_10 = one_argument((char *)in_stack_ffffffffffffb760,(char *)in_stack_ffffffffffffb758);
  }
  if (local_1218 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
  }
  else if (local_2418 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
  }
  else if (local_3618 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
  }
  else if (*local_10 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
  }
  else {
    bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
    if ((bVar2) && (bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780), bVar2))
    {
      bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
      if (bVar2) {
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        return;
      }
      pOVar5 = get_obj_world(in_stack_ffffffffffffc968,in_stack_ffffffffffffc960);
      if (pOVar5 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        return;
      }
      bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
      if (bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
        if (bVar2) {
          send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
          return;
        }
        local_4830 = (flag_type *)pOVar5->extra_flags;
        local_4850 = extra_flags;
      }
      else {
        local_4830 = (flag_type *)pOVar5->wear_flags;
        local_4850 = wear_flags;
      }
    }
    else {
      pCVar4 = get_char_world(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
      if (pCVar4 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
        return;
      }
      bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
      if (bVar2) {
        bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
        if (bVar2) {
          bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
          if (bVar2) {
            bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
            if (bVar2) {
              bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
              if (bVar2) {
                bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
                if (bVar2) {
                  bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
                  if (bVar2) {
                    bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
                    if (bVar2) {
                      bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
                      if (bVar2) {
                        bVar2 = str_prefix(in_stack_ffffffffffffb788,in_stack_ffffffffffffb780);
                        if (bVar2) {
                          send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
                          return;
                        }
                        bVar2 = is_npc(in_stack_ffffffffffffb758);
                        if (bVar2) {
                          send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
                          return;
                        }
                        local_4830 = (flag_type *)pCVar4->comm;
                        local_4850 = comm_flags;
                      }
                      else {
                        bVar2 = is_npc(in_stack_ffffffffffffb758);
                        if (!bVar2) {
                          send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
                          return;
                        }
                        local_4830 = (flag_type *)pCVar4->parts;
                        local_4850 = part_flags;
                      }
                    }
                    else {
                      bVar2 = is_npc(in_stack_ffffffffffffb758);
                      if (!bVar2) {
                        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
                        return;
                      }
                      local_4830 = (flag_type *)pCVar4->form;
                      local_4850 = form_flags;
                    }
                  }
                  else {
                    bVar2 = is_npc(in_stack_ffffffffffffb758);
                    if (!bVar2) {
                      send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
                      return;
                    }
                    local_4830 = (flag_type *)pCVar4->off_flags;
                    local_4850 = off_flags;
                  }
                }
                else {
                  local_4830 = (flag_type *)pCVar4->vuln_flags;
                  local_4850 = imm_flags;
                }
              }
              else {
                local_4830 = (flag_type *)pCVar4->res_flags;
                local_4850 = imm_flags;
              }
            }
            else {
              local_4830 = (flag_type *)pCVar4->imm_flags;
              local_4850 = imm_flags;
            }
          }
          else {
            local_4830 = (flag_type *)pCVar4->affected_by;
            local_4850 = affect_flags;
          }
        }
        else {
          bVar2 = is_npc(in_stack_ffffffffffffb758);
          if (bVar2) {
            send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
            return;
          }
          local_4830 = (flag_type *)pCVar4->act;
          local_4850 = plr_flags;
        }
      }
      else {
        bVar2 = is_npc(in_stack_ffffffffffffb758);
        if (!bVar2) {
          send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
          return;
        }
        local_4830 = (flag_type *)pCVar4->act;
        local_4850 = act_flags;
      }
    }
    do {
      one_argument((char *)in_stack_ffffffffffffb760,(char *)in_stack_ffffffffffffb758);
      if (local_4818 == '\0') {
        local_4838 = 0;
        goto LAB_005f220c;
      }
      iVar3 = flag_lookup((char *)in_stack_ffffffffffffb768,in_stack_ffffffffffffb760);
      local_4840 = (long)iVar3;
    } while (local_4840 != -99);
    send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
  }
  return;
LAB_005f220c:
  if (local_4850[local_4838].name == (char *)0x0) {
    return;
  }
  iVar3 = get_trust(in_stack_ffffffffffffb758);
  if (((iVar3 == 0x3c) || ((local_4850[local_4838].settable & 1U) != 0)) &&
     (local_4850[local_4838].bit == local_4840)) {
    iVar3 = (int)((ulong)in_stack_ffffffffffffb760 >> 0x20);
    if (cVar1 == '+') {
LAB_005f2299:
      _Var7 = std::pow<int,long>(iVar3,(long)in_stack_ffffffffffffb758);
      iVar3 = (int)((long)((ulong)(uint)((int)local_4850[local_4838].bit >> 0x1f) << 0x20 |
                          local_4850[local_4838].bit & 0xffffffffU) / 0x20);
      (&local_4830->name)[iVar3] = (char *)((long)_Var7 | (ulong)(&local_4830->name)[iVar3]);
      send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    }
    else if (cVar1 == '-') {
      _Var7 = std::pow<int,long>(iVar3,(long)in_stack_ffffffffffffb758);
      lVar6 = local_4850[local_4838].bit / 0x20;
      (&local_4830->name)[lVar6] =
           (char *)(((long)_Var7 ^ 0xffffffffffffffffU) & (ulong)(&local_4830->name)[lVar6]);
      send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
    }
    else {
      if (cVar1 == '=') goto LAB_005f2299;
      pcVar8 = (&local_4830->name)[(int)(local_4850[local_4838].bit / 0x20)];
      _Var7 = std::pow<int,long>(iVar3,(long)in_stack_ffffffffffffb758);
      iVar3 = (int)((ulong)in_stack_ffffffffffffb760 >> 0x20);
      if (((ulong)pcVar8 & (long)_Var7) == 0) {
        _Var7 = std::pow<int,long>(iVar3,(long)in_stack_ffffffffffffb758);
        in_stack_ffffffffffffb758 = (CHAR_DATA *)(long)_Var7;
        iVar3 = (int)((long)((ulong)(uint)((int)local_4850[local_4838].bit >> 0x1f) << 0x20 |
                            local_4850[local_4838].bit & 0xffffffffU) / 0x20);
        (&local_4830->name)[iVar3] =
             (char *)((ulong)in_stack_ffffffffffffb758 | (ulong)(&local_4830->name)[iVar3]);
        in_stack_ffffffffffffb760 = local_4830;
        send_to_char((char *)in_stack_ffffffffffffb770,in_stack_ffffffffffffb768);
      }
      else {
        _Var7 = std::pow<int,long>(iVar3,(long)in_stack_ffffffffffffb758);
        in_stack_ffffffffffffb768 = (CHAR_DATA *)((long)_Var7 ^ 0xffffffffffffffff);
        lVar6 = local_4850[local_4838].bit / 0x20;
        (&local_4830->name)[lVar6] =
             (char *)((ulong)in_stack_ffffffffffffb768 & (ulong)(&local_4830->name)[lVar6]);
        in_stack_ffffffffffffb770 = local_4830;
        send_to_char((char *)local_4830,in_stack_ffffffffffffb768);
      }
    }
  }
  local_4838 = local_4838 + 1;
  goto LAB_005f220c;
}

Assistant:

void do_flag(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH], arg3[MAX_INPUT_LENGTH];
	char word[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	long *flag = 0;
	long pos, pos2 = NO_FLAG;
	char type;
	const struct flag_type *flag_table;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	type = argument[0];

	if (type == '=' || type == '-' || type == '+')
		argument = one_argument(argument, word);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("What do you wish to set flags on?\n\r", ch);
		return;
	}

	if (arg3[0] == '\0')
	{
		send_to_char("You need to specify a flag to set.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Which flags do you wish to change?\n\r", ch);
		return;
	}

	if (!str_prefix(arg1, "mob") || !str_prefix(arg1, "char"))
	{
		victim = get_char_world(ch, arg2);
		if (victim == nullptr)
		{
			send_to_char("You can't find them.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "act"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Use plr for PCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = act_flags;
		}
		else if (!str_prefix(arg3, "plr"))
		{
			if (is_npc(victim))
			{
				send_to_char("Use act for NPCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = plr_flags;
		}
		else if (!str_prefix(arg3, "aff"))
		{
			flag = &victim->affected_by[0];
			flag_table = affect_flags;
		}
		else if (!str_prefix(arg3, "immunity"))
		{
			flag = &victim->imm_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "resist"))
		{
			flag = &victim->res_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "vuln"))
		{
			flag = &victim->vuln_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "off"))
		{
			if (!is_npc(victim))
			{
				send_to_char("OFF can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->off_flags[0];
			flag_table = off_flags;
		}
		else if (!str_prefix(arg3, "form"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Form can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->form[0];
			flag_table = form_flags;
		}
		else if (!str_prefix(arg3, "parts"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Parts can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->parts[0];
			flag_table = part_flags;
		}
		else if (!str_prefix(arg3, "comm"))
		{
			if (is_npc(victim))
			{
				send_to_char("Comm can't be set on NPCs.\n\r", ch);
				return;
			}
			flag = &victim->comm[0];
			flag_table = comm_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg1, "obj"))
	{
		if ((obj = get_obj_world(ch, arg2)) == nullptr)
		{
			send_to_char("Nothing like that anywhere.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "wear"))
		{
			flag = &obj->wear_flags[0];
			flag_table = wear_flags;
		}
		else if (!str_prefix(arg3, "extra"))
		{
			flag = &obj->extra_flags[0];
			flag_table = extra_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	/* mark the words */
	for (;;)
	{
		argument = one_argument(argument, word);

		if (word[0] == '\0')
			break;

		pos2 = flag_lookup(word, flag_table);

		if (pos2 == NO_FLAG)
		{
			send_to_char("That flag doesn't exist!\n\r", ch);
			return;
		}
	}

	for (pos = 0; flag_table[pos].name != nullptr; pos++)
	{
		if ((get_trust(ch) == MAX_LEVEL || flag_table[pos].settable) && flag_table[pos].bit == pos2)
		{
			switch (type)
			{
				case '=':
				case '+':
					SET_BIT(flag, flag_table[pos].bit);
					send_to_char("You set that flag.\n\r", ch);
					break;
				case '-':
					REMOVE_BIT(flag, flag_table[pos].bit);
					send_to_char("You removed that flag.\n\r", ch);
					break;
				default:
					if (IS_SET(flag, flag_table[pos].bit))
					{
						REMOVE_BIT(flag, flag_table[pos].bit);
						send_to_char("You removed that flag.\n\r", ch);
					}
					else
					{
						SET_BIT(flag, flag_table[pos].bit);
						send_to_char("You set that flag.\n\r", ch);
					}
			}
		}
		else
		{
			continue;
		}
	}
}